

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceTiledExamples.cpp
# Opt level: O1

void readTiledRgba1(char *fileName,Array2D<Imf_3_2::Rgba> *pixels,int *width,int *height)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  Rgba *pRVar5;
  long lVar6;
  long lVar7;
  TiledRgbaInputFile in;
  Rgba local_68 [7];
  
  iVar2 = Imf_3_2::globalThreadCount();
  Imf_3_2::TiledRgbaInputFile::TiledRgbaInputFile((TiledRgbaInputFile *)local_68,fileName,iVar2);
  piVar4 = (int *)Imf_3_2::TiledRgbaInputFile::dataWindow();
  iVar2 = *piVar4;
  iVar3 = piVar4[1];
  iVar1 = piVar4[3];
  *width = (piVar4[2] - iVar2) + 1;
  lVar7 = ((long)iVar1 - (long)iVar3) + 1;
  *height = (int)lVar7;
  lVar6 = (long)*width;
  pRVar5 = (Rgba *)operator_new__(-(ulong)((ulong)(lVar6 * lVar7) >> 0x3d != 0) | lVar6 * lVar7 * 8)
  ;
  if (pixels->_data != (Rgba *)0x0) {
    operator_delete__(pixels->_data);
  }
  pixels->_sizeX = lVar7;
  pixels->_sizeY = lVar6;
  pixels->_data = pRVar5;
  Imf_3_2::TiledRgbaInputFile::setFrameBuffer
            (local_68,(ulong)(pRVar5 + -(long)iVar3 * lVar6 + (long)-iVar2),1);
  iVar2 = Imf_3_2::TiledRgbaInputFile::numXTiles((int)local_68);
  iVar3 = Imf_3_2::TiledRgbaInputFile::numYTiles((int)local_68);
  Imf_3_2::TiledRgbaInputFile::readTiles((int)local_68,0,iVar2 + -1,0,iVar3 + -1);
  Imf_3_2::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)local_68);
  return;
}

Assistant:

void
readTiledRgba1 (
    const char fileName[], Array2D<Rgba>& pixels, int& width, int& height)
{
    TiledRgbaInputFile in (fileName);
    Box2i              dw = in.dataWindow ();

    width  = dw.max.x - dw.min.x + 1;
    height = dw.max.y - dw.min.y + 1;
    int dx = dw.min.x;
    int dy = dw.min.y;

    pixels.resizeErase (height, width);

    in.setFrameBuffer (&pixels[-dy][-dx], 1, width);
    in.readTiles (0, in.numXTiles () - 1, 0, in.numYTiles () - 1);
}